

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv2maropu.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  long lVar2;
  FILE *__s;
  size_t sVar3;
  ostream *poVar4;
  int iVar5;
  int iVar6;
  uint32_t MAXSIZE;
  vector<unsigned_int,_std::allocator<unsigned_int>_> container;
  string ofilename;
  uint32_t tsize;
  string ifilename;
  CSVFlatFile cvs;
  int local_34c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_348;
  char *local_330;
  long local_328;
  char local_320 [20];
  int local_30c;
  char *local_308 [2];
  char local_2f8 [16];
  CSVFlatFile local_2e8;
  
  if (argc < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               " This will map a table (stored in a CSV file) to a row  oriented flat file of frequency attributed 32-bit integers "
               ,0x73);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," usage : cvs2maropu mycvsfile.cvs mymaropufile.bin ",0x33);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    iVar5 = -1;
  }
  else {
    std::__cxx11::string::string((string *)local_308,argv[1],(allocator *)&local_2e8);
    std::__cxx11::string::string((string *)&local_330,argv[2],(allocator *)&local_2e8);
    FastPForLib::CSVFlatFile::CSVFlatFile(&local_2e8,local_308[0],0);
    lVar2 = (long)local_2e8.mapping.
                  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_2e8.mapping.
                  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    iVar6 = (int)(lVar2 * -0x5555555555555555);
    iVar5 = (int)local_2e8.NumberOfLines * iVar6;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_348,lVar2 * -0x5555555555555555,(allocator_type *)&local_34c);
    __s = fopen(local_330,"w+b");
    if (__s == (FILE *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," could not open ",0x10);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_330,local_328);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," for writing...",0xf);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      iVar5 = -1;
      std::ifstream::close();
    }
    else {
      local_34c = iVar6 << 0x14;
      if (iVar5 == 0) {
        do {
          sVar3 = fwrite(&local_34c,4,1,__s);
          if (sVar3 != 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"aborting",8);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
            std::ostream::put(-0x30);
            std::ostream::flush();
            fclose(__s);
            iVar5 = -1;
            std::ifstream::close();
            goto LAB_001029c9;
          }
          iVar5 = 0;
          do {
            bVar1 = FastPForLib::CSVFlatFile::
                    nextRow<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                              (&local_2e8,&local_348);
            if (!bVar1) break;
            sVar3 = fwrite(local_348.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start,lVar2 * -0x5555555555555554,1,
                           __s);
            if (sVar3 != 1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"aborting",8)
              ;
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
              std::ostream::put(-0x30);
              std::ostream::flush();
              fclose(__s);
              iVar5 = -1;
              std::ifstream::close();
              goto LAB_001029c9;
            }
            iVar5 = iVar5 + iVar6;
          } while (iVar5 != 0);
        } while (local_34c == 0);
        iVar5 = -local_34c;
      }
      local_30c = iVar5;
      sVar3 = fwrite(&local_30c,4,1,__s);
      if (sVar3 == 1) {
        do {
          bVar1 = FastPForLib::CSVFlatFile::
                  nextRow<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                            (&local_2e8,&local_348);
          if (!bVar1) {
            fclose(__s);
            std::ifstream::close();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#file ",6);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_330,local_328);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," contains your data.",0x14);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            iVar5 = 0;
            std::ostream::flush();
            goto LAB_001029c9;
          }
          sVar3 = fwrite(local_348.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start,lVar2 * -0x5555555555555554,1,__s)
          ;
        } while (sVar3 == 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"aborting",8);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      fclose(__s);
      std::ifstream::close();
      iVar5 = -1;
    }
LAB_001029c9:
    if (local_348.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_348.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>_>
    ::~vector(&local_2e8.mapping);
    FastPForLib::CSVReader::~CSVReader(&local_2e8.mainreader);
    std::ifstream::~ifstream(&local_2e8);
    if (local_330 != local_320) {
      operator_delete(local_330);
    }
    if (local_308[0] != local_2f8) {
      operator_delete(local_308[0]);
    }
  }
  return iVar5;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 3) {
    cerr << " This will map a table (stored in a CSV file) to a row "
            " oriented flat file of frequency attributed 32-bit integers "
         << endl;
    cerr << " usage : cvs2maropu mycvsfile.cvs mymaropufile.bin " << endl;
    return -1;
  }
  string ifilename(argv[1]);
  string ofilename(argv[2]);
  CSVFlatFile cvs(ifilename.c_str(), CSVFlatFile::FREQNORMALISATION);
  const size_t c = cvs.getNumberOfColumns();
  const size_t N = cvs.getNumberOfRows();
  size_t integers = static_cast<uint32_t>(c * N);
  vector<uint32_t> container(c);
  FILE *fd = ::fopen(ofilename.c_str(), "w+b");
  if (fd == NULL) {
    cout << " could not open " << ofilename << " for writing..." << endl;
    cvs.close();
    return -1;
  }
  uint32_t MAXSIZE = static_cast<uint32_t>(c * (1U << 20));
  for (size_t block = 0; block * MAXSIZE >= integers; integers -= MAXSIZE) {
    if (fwrite(&MAXSIZE, sizeof(MAXSIZE), 1, fd) != 1) {
      cerr << "aborting" << endl;
      ::fclose(fd);
      cvs.close();
      return -1;
    }
    uint32_t counter = 0;
    while (cvs.nextRow(container)) {
      if (fwrite(&container[0], c * sizeof(uint32_t), 1, fd) != 1) {
        cerr << "aborting" << endl;
        ::fclose(fd);
        cvs.close();
        return -1;
      }
      counter += static_cast<uint32_t>(c);
      if (counter == block)
        break;
      assert(counter < block);
    }
  }
  if (integers > 0) {
    uint32_t tsize = static_cast<uint32_t>(integers);
    if (fwrite(&tsize, sizeof(tsize), 1, fd) != 1) {
      cerr << "aborting" << endl;
      ::fclose(fd);
      cvs.close();
      return -1;
    }
    while (cvs.nextRow(container)) {
      if (fwrite(&container[0], c * sizeof(uint32_t), 1, fd) != 1) {
        cerr << "aborting" << endl;
        ::fclose(fd);
        cvs.close();
        return -1;
      }
    }
  }
  ::fclose(fd);
  cvs.close();
  cout << "#file " << ofilename << " contains your data." << endl;
}